

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateEncoderUnionBody(SwiftGenerator *this,FieldDef *field)

{
  CodeWriter *pCVar1;
  int *piVar2;
  Type *pTVar3;
  BaseType BVar4;
  int iVar5;
  EnumVal *pEVar6;
  pointer ppEVar7;
  string *this_00;
  string type;
  allocator<char> local_2f1;
  EnumDef *local_2f0;
  string local_2e8;
  IdlNamer *local_2c8;
  pointer local_2c0;
  SwiftGenerator *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  BVar4 = (field->value).type.base_type;
  if (BVar4 == BASE_TYPE_UTYPE) {
    return;
  }
  local_2f0 = (field->value).type.enum_def;
  local_2b8 = this;
  if ((BVar4 == BASE_TYPE_ARRAY) || (BVar4 == BASE_TYPE_VECTOR)) {
    if ((field->value).type.element == BASE_TYPE_UTYPE) {
      return;
    }
    if ((BVar4 == BASE_TYPE_ARRAY) || (BVar4 == BASE_TYPE_VECTOR)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,
                 "var enumsEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}}Type)",
                 (allocator<char> *)&local_2e8);
      pCVar1 = &this->code_;
      CodeWriter::operator+=(pCVar1,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,
                 "var contentEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}})",
                 (allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"for index in 0..<{{FIELDVAR}}Count {",
                 (allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      piVar2 = &(this->code_).cur_ident_lvl_;
      *piVar2 = *piVar2 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,
                 "guard let type = {{FIELDVAR}}Type(at: index) else { continue }",
                 (allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"try enumsEncoder.encode(type)",(allocator<char> *)&local_2e8)
      ;
      CodeWriter::operator+=(pCVar1,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"switch type {",(allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      local_2c8 = &this->namer_;
      ppEVar7 = (local_2f0->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (ppEVar7 !=
             (local_2f0->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        pEVar6 = *ppEVar7;
        pTVar3 = &pEVar6->union_type;
        local_2c0 = ppEVar7;
        GenType_abi_cxx11_(&local_2e8,this,pTVar3,false);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"KEY",&local_2f1);
        IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_1d0,local_2c8,pEVar6);
        CodeWriter::SetValue(pCVar1,&local_2b0,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"VALUETYPE",(allocator<char> *)&local_1d0);
        CodeWriter::SetValue(pCVar1,&local_2b0,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2b0);
        this = local_2b8;
        if (pTVar3->base_type != BASE_TYPE_NONE) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"case .{{KEY}}:",(allocator<char> *)&local_2b0);
          CodeWriter::operator+=(pCVar1,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          piVar2 = &(this->code_).cur_ident_lvl_;
          *piVar2 = *piVar2 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,
                     "let _v = {{FIELDVAR}}(at: index, type: {{VALUETYPE}}.self)",
                     (allocator<char> *)&local_2b0);
          CodeWriter::operator+=(pCVar1,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"try contentEncoder.encode(_v)",
                     (allocator<char> *)&local_2b0);
          CodeWriter::operator+=(pCVar1,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          iVar5 = (this->code_).cur_ident_lvl_;
          if (iVar5 != 0) {
            (this->code_).cur_ident_lvl_ = iVar5 + -1;
          }
        }
        std::__cxx11::string::~string((string *)&local_2e8);
        ppEVar7 = local_2c0 + 1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"default: break;",(allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"}",(allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      iVar5 = (this->code_).cur_ident_lvl_;
      if (iVar5 != 0) {
        (this->code_).cur_ident_lvl_ = iVar5 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"}",(allocator<char> *)&local_2e8);
      CodeWriter::operator+=(pCVar1,&local_230);
      this_00 = &local_230;
      goto LAB_002184f3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"switch {{FIELDVAR}}Type {",(allocator<char> *)&local_2e8);
  pCVar1 = &this->code_;
  CodeWriter::operator+=(pCVar1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  local_2c8 = &this->namer_;
  ppEVar7 = (local_2f0->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while (ppEVar7 !=
         (local_2f0->vals).vec.
         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl
         .super__Vector_impl_data._M_finish) {
    pEVar6 = *ppEVar7;
    pTVar3 = &pEVar6->union_type;
    local_2c0 = ppEVar7;
    GenType_abi_cxx11_(&local_2e8,this,pTVar3,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"KEY",&local_2f1);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_1d0,local_2c8,pEVar6);
    CodeWriter::SetValue(pCVar1,&local_2b0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"VALUETYPE",(allocator<char> *)&local_1d0);
    CodeWriter::SetValue(pCVar1,&local_2b0,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2b0);
    this = local_2b8;
    if (pTVar3->base_type != BASE_TYPE_NONE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"case .{{KEY}}:",(allocator<char> *)&local_2b0);
      CodeWriter::operator+=(pCVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      piVar2 = &(this->code_).cur_ident_lvl_;
      *piVar2 = *piVar2 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"let _v = {{FIELDVAR}}(type: {{VALUETYPE}}.self)",
                 (allocator<char> *)&local_2b0);
      CodeWriter::operator+=(pCVar1,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"try container.encodeIfPresent(_v, forKey: .{{FIELDVAR}})",
                 (allocator<char> *)&local_2b0);
      CodeWriter::operator+=(pCVar1,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      iVar5 = (this->code_).cur_ident_lvl_;
      if (iVar5 != 0) {
        (this->code_).cur_ident_lvl_ = iVar5 + -1;
      }
    }
    std::__cxx11::string::~string((string *)&local_2e8);
    ppEVar7 = local_2c0 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"default: break;",(allocator<char> *)&local_2e8);
  CodeWriter::operator+=(pCVar1,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"}",(allocator<char> *)&local_2e8);
  CodeWriter::operator+=(pCVar1,&local_290);
  this_00 = &local_290;
LAB_002184f3:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void GenerateEncoderUnionBody(const FieldDef &field) {
    EnumDef &union_def = *field.value.type.enum_def;
    const auto is_vector = field.value.type.base_type == BASE_TYPE_VECTOR ||
                           field.value.type.base_type == BASE_TYPE_ARRAY;
    if (field.value.type.base_type == BASE_TYPE_UTYPE ||
        (is_vector &&
         field.value.type.VectorType().base_type == BASE_TYPE_UTYPE))
      return;
    if (is_vector) {
      code_ +=
          "var enumsEncoder = container.nestedUnkeyedContainer(forKey: "
          ".{{FIELDVAR}}Type)";
      code_ +=
          "var contentEncoder = container.nestedUnkeyedContainer(forKey: "
          ".{{FIELDVAR}})";
      code_ += "for index in 0..<{{FIELDVAR}}Count {";
      Indent();
      code_ += "guard let type = {{FIELDVAR}}Type(at: index) else { continue }";
      code_ += "try enumsEncoder.encode(type)";
      code_ += "switch type {";
      for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        const auto type = GenType(ev.union_type);
        code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
        code_.SetValue("VALUETYPE", type);
        if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
        code_ += "case .{{KEY}}:";
        Indent();
        code_ += "let _v = {{FIELDVAR}}(at: index, type: {{VALUETYPE}}.self)";
        code_ += "try contentEncoder.encode(_v)";
        Outdent();
      }
      code_ += "default: break;";
      code_ += "}";
      Outdent();
      code_ += "}";
      return;
    }

    code_ += "switch {{FIELDVAR}}Type {";
    for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
         ++it) {
      const auto &ev = **it;
      const auto type = GenType(ev.union_type);
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUETYPE", type);
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_ += "case .{{KEY}}:";
      Indent();
      code_ += "let _v = {{FIELDVAR}}(type: {{VALUETYPE}}.self)";
      code_ += "try container.encodeIfPresent(_v, forKey: .{{FIELDVAR}})";
      Outdent();
    }
    code_ += "default: break;";
    code_ += "}";
  }